

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetMetricQueryPoolDestroyPrologue
          (ZETHandleLifetimeValidation *this,zet_metric_query_pool_handle_t hMetricQueryPool)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = context;
  if ((hMetricQueryPool == (zet_metric_query_pool_handle_t)0x0) ||
     (bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(context + 0xd48),hMetricQueryPool), !bVar2))
  {
    bVar2 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hMetricQueryPool);
    if (!bVar2) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
  else {
    bVar2 = HandleLifetimeValidation::hasDependents
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hMetricQueryPool);
    if (bVar2) {
      return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    HandleLifetimeValidation::removeDependent
              (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hMetricQueryPool);
    HandleLifetimeValidation::removeHandle
              (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hMetricQueryPool);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetMetricQueryPoolDestroyPrologue(
        zet_metric_query_pool_handle_t hMetricQueryPool ///< [in][release] handle of the metric query pool
        )
    { 
        
        if (hMetricQueryPool && context.handleLifetime->isHandleValid( hMetricQueryPool )){
            if (context.handleLifetime->hasDependents( hMetricQueryPool )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hMetricQueryPool);
            context.handleLifetime->removeHandle( hMetricQueryPool );
        } else if (!context.handleLifetime->isHandleValid( hMetricQueryPool )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }